

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManDumpAll(If_DsdMan_t *p,int Support)

{
  word *pRes;
  uint uVar1;
  FILE *__s;
  uint uVar2;
  long lVar3;
  long lVar4;
  word *pwVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  __s = fopen("tts_all.txt","wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_all.txt");
    return;
  }
  iVar6 = (p->vObjs).nSize;
  if (0 < iVar6) {
    uVar2 = 6;
    if (6 < (uint)Support) {
      uVar2 = Support;
    }
    lVar3 = 0;
    do {
      if ((Support == 0) || ((*(uint *)((long)(p->vObjs).pArray[lVar3] + 4) >> 3 & 0x1f) == Support)
         ) {
        pRes = p->pTtElems[0xc];
        If_DsdManComputeTruthPtr(p,(int)lVar3 * 2,(uchar *)0x0,pRes);
        fwrite("0x",2,1,__s);
        bVar10 = true;
        uVar1 = uVar2;
        if (Support == 0) {
          uVar1 = p->nVars;
          bVar10 = 5 < uVar1;
          if ((int)uVar1 < 2) {
            __assert_fail("nVars >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
          }
        }
        iVar6 = 1 << ((char)uVar1 - 6U & 0x1f);
        if (uVar1 < 7) {
          iVar6 = 1;
        }
        pwVar5 = pRes + (long)iVar6 + -1;
        if (pRes <= pwVar5) {
          uVar7 = (ulong)(uint)~(-1 << ((char)uVar1 - 2U & 0x1f));
          if (bVar10) {
            uVar7 = 0xf;
          }
          lVar4 = uVar7 << 2;
          lVar8 = uVar7 + 1;
          do {
            uVar1 = (uint)(*pwVar5 >> ((byte)lVar4 & 0x3c)) & 0xf;
            iVar6 = uVar1 + 0x30;
            if (9 < uVar1) {
              iVar6 = uVar1 + 0x37;
            }
            fputc(iVar6,__s);
            lVar9 = lVar8 + -1;
            bVar10 = 0 < lVar8;
            lVar4 = lVar4 + -4;
            lVar8 = lVar9;
          } while ((lVar9 != 0 && bVar10) ||
                  (pwVar5 = pwVar5 + -1, lVar4 = uVar7 << 2, lVar8 = uVar7 + 1, pRes <= pwVar5));
        }
        fputc(10,__s);
        iVar6 = (p->vObjs).nSize;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar6);
  }
  fclose(__s);
  return;
}

Assistant:

void If_DsdManDumpAll( If_DsdMan_t * p, int Support )
{
    extern word * If_DsdManComputeTruth( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits );
    char * pFileName = "tts_all.txt";
    If_DsdObj_t * pObj;
    word * pRes; int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        pRes = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        fprintf( pFile, "0x" );
        Abc_TtPrintHexRev( pFile, pRes, Support ? Abc_MaxInt(Support, 6) : p->nVars );
        fprintf( pFile, "\n" );
//        printf( "    " );
//        Dau_DsdPrintFromTruth( pRes, p->nVars );
    }
    fclose( pFile );
}